

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode inflate_stream(connectdata *conn,contenc_writer *writer,zlibInitState started)

{
  int iVar1;
  Bytef *pBVar2;
  bool bVar3;
  int iVar4;
  CURLcode result_00;
  void **zp_00;
  z_stream *z_00;
  content_encoding *buf;
  char *decomp;
  CURLcode result;
  _Bool done;
  int status;
  Bytef *orig_in;
  uInt nread;
  z_stream *z;
  zlib_params *zp;
  zlibInitState started_local;
  contenc_writer *writer_local;
  connectdata *conn_local;
  
  zp_00 = &writer->params;
  z_00 = (z_stream *)(writer + 1);
  iVar1 = *(int *)&writer[1].downstream;
  pBVar2 = z_00->next_in;
  bVar3 = false;
  decomp._4_4_ = CURLE_OK;
  if ((((*(int *)zp_00 == 1) || (*(int *)zp_00 == 2)) || (*(int *)zp_00 == 6)) ||
     (*(int *)zp_00 == 5)) {
    buf = (content_encoding *)(*Curl_cmalloc)(0x4000);
    if (buf == (content_encoding *)0x0) {
      conn_local._4_4_ = exit_zlib(conn,z_00,(zlibInitState *)zp_00,CURLE_OUT_OF_MEMORY);
    }
    else {
LAB_00144159:
      if (!bVar3) {
        bVar3 = true;
        writer[2].handler = buf;
        *(undefined4 *)&writer[2].downstream = 0x4000;
        iVar4 = inflate(z_00,5);
        if ((*(int *)&writer[2].downstream != 0x4000) && ((iVar4 == 0 || (iVar4 == 1)))) {
          *(zlibInitState *)zp_00 = started;
          decomp._4_4_ = Curl_unencode_write(conn,writer->downstream,(char *)buf,
                                             (ulong)(0x4000 - *(int *)&writer[2].downstream));
          if (decomp._4_4_ != CURLE_OK) {
            exit_zlib(conn,z_00,(zlibInitState *)zp_00,decomp._4_4_);
            goto LAB_001442ee;
          }
        }
        switch(iVar4) {
        case 0:
          bVar3 = false;
          break;
        case 1:
          goto switchD_00144227_caseD_1;
        case -5:
          break;
        case -3:
          if (*(int *)zp_00 == 1) {
            inflateEnd(z_00);
            iVar4 = inflateInit2_(z_00,0xfffffff1,"1.2.11",0x70);
            if (iVar4 == 0) {
              z_00->next_in = pBVar2;
              *(int *)&writer[1].downstream = iVar1;
              *(undefined4 *)zp_00 = 2;
              bVar3 = false;
              break;
            }
            *(undefined4 *)zp_00 = 0;
          }
        default:
          result_00 = process_zlib_error(conn,z_00);
          decomp._4_4_ = exit_zlib(conn,z_00,(zlibInitState *)zp_00,result_00);
        }
        goto LAB_00144159;
      }
LAB_001442ee:
      (*Curl_cfree)(buf);
      if ((iVar1 != 0) && (*(int *)zp_00 == 1)) {
        *(zlibInitState *)zp_00 = started;
      }
      conn_local._4_4_ = decomp._4_4_;
    }
  }
  else {
    conn_local._4_4_ = exit_zlib(conn,z_00,(zlibInitState *)zp_00,CURLE_WRITE_ERROR);
  }
  return conn_local._4_4_;
switchD_00144227_caseD_1:
  decomp._4_4_ = process_trailer(conn,(zlib_params *)zp_00);
  goto LAB_00144159;
}

Assistant:

static CURLcode inflate_stream(struct connectdata *conn,
                               contenc_writer *writer, zlibInitState started)
{
  zlib_params *zp = (zlib_params *) &writer->params;
  z_stream *z = &zp->z;         /* zlib state structure */
  uInt nread = z->avail_in;
  Bytef *orig_in = z->next_in;
  int status;                   /* zlib status */
  bool done = FALSE;
  CURLcode result = CURLE_OK;   /* Curl_client_write status */
  char *decomp;                 /* Put the decompressed data here. */

  /* Check state. */
  if(zp->zlib_init != ZLIB_INIT &&
     zp->zlib_init != ZLIB_INFLATING &&
     zp->zlib_init != ZLIB_INIT_GZIP &&
     zp->zlib_init != ZLIB_GZIP_INFLATING)
    return exit_zlib(conn, z, &zp->zlib_init, CURLE_WRITE_ERROR);

  /* Dynamically allocate a buffer for decompression because it's uncommonly
     large to hold on the stack */
  decomp = malloc(DSIZ);
  if(decomp == NULL)
    return exit_zlib(conn, z, &zp->zlib_init, CURLE_OUT_OF_MEMORY);

  /* because the buffer size is fixed, iteratively decompress and transfer to
     the client via downstream_write function. */
  while(!done) {
    done = TRUE;

    /* (re)set buffer for decompressed output for every iteration */
    z->next_out = (Bytef *) decomp;
    z->avail_out = DSIZ;

    status = inflate(z, Z_BLOCK);

    /* Flush output data if some. */
    if(z->avail_out != DSIZ) {
      if(status == Z_OK || status == Z_STREAM_END) {
        zp->zlib_init = started;      /* Data started. */
        result = Curl_unencode_write(conn, writer->downstream, decomp,
                                     DSIZ - z->avail_out);
        if(result) {
          exit_zlib(conn, z, &zp->zlib_init, result);
          break;
        }
      }
    }

    /* Dispatch by inflate() status. */
    switch(status) {
    case Z_OK:
      /* Always loop: there may be unflushed latched data in zlib state. */
      done = FALSE;
      break;
    case Z_BUF_ERROR:
      /* No more data to flush: just exit loop. */
      break;
    case Z_STREAM_END:
      result = process_trailer(conn, zp);
      break;
    case Z_DATA_ERROR:
      /* some servers seem to not generate zlib headers, so this is an attempt
         to fix and continue anyway */
      if(zp->zlib_init == ZLIB_INIT) {
        /* Do not use inflateReset2(): only available since zlib 1.2.3.4. */
        (void) inflateEnd(z);     /* don't care about the return code */
        if(inflateInit2(z, -MAX_WBITS) == Z_OK) {
          z->next_in = orig_in;
          z->avail_in = nread;
          zp->zlib_init = ZLIB_INFLATING;
          done = FALSE;
          break;
        }
        zp->zlib_init = ZLIB_UNINIT;    /* inflateEnd() already called. */
      }
      /* FALLTHROUGH */
    default:
      result = exit_zlib(conn, z, &zp->zlib_init, process_zlib_error(conn, z));
      break;
    }
  }
  free(decomp);

  /* We're about to leave this call so the `nread' data bytes won't be seen
     again. If we are in a state that would wrongly allow restart in raw mode
     at the next call, assume output has already started. */
  if(nread && zp->zlib_init == ZLIB_INIT)
    zp->zlib_init = started;      /* Cannot restart anymore. */

  return result;
}